

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_uint64 ma_dr_wav_write_pcm_frames_be(ma_dr_wav *pWav,ma_uint64 framesToWrite,void *pData)

{
  ma_uint32 mVar1;
  uint uVar2;
  size_t sVar3;
  void *in_RDX;
  long in_RSI;
  ma_dr_wav *in_RDI;
  ma_uint64 bytesToWriteThisIteration;
  size_t bytesJustWritten;
  ma_uint32 sampleCount;
  ma_uint8 temp [4096];
  ma_uint8 *pRunningData;
  ma_uint32 bytesPerSample;
  ma_uint64 bytesWritten;
  ma_uint64 bytesToWrite;
  ma_uint64 iSample;
  ma_uint64 iSample_2;
  ma_uint8 *pSample;
  ma_uint64 iSample_1;
  ma_uint64 iSample_3;
  ma_uint8 t;
  void *in_stack_ffffffffffffeed8;
  undefined1 *__dest;
  size_t local_1110;
  undefined1 local_10f8 [4104];
  void *local_f0;
  uint local_e4;
  long local_e0;
  ulong local_d8;
  ma_dr_wav *local_c0;
  ulong local_b8;
  uint local_ac;
  ulong local_a8;
  undefined1 *local_a0;
  ulong local_98;
  ulong local_90;
  undefined1 *local_88;
  ulong local_80;
  ulong local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  ulong local_60;
  ulong local_58;
  undefined1 *local_50;
  ulong local_48;
  ulong local_40;
  undefined1 *local_38;
  undefined1 local_29;
  undefined1 *local_28;
  ulong local_20;
  ulong local_18;
  ushort local_c;
  ushort local_a;
  uint local_8;
  uint local_4;
  
  if (((in_RDI == (ma_dr_wav *)0x0) || (in_RSI == 0)) || (in_RDX == (void *)0x0)) {
    local_b8 = 0;
  }
  else {
    local_d8 = in_RSI * (ulong)in_RDI->channels * (ulong)in_RDI->bitsPerSample >> 3;
    local_e0 = 0;
    local_f0 = in_RDX;
    local_c0 = in_RDI;
    mVar1 = ma_dr_wav_get_bytes_per_pcm_frame(in_RDI);
    local_e4 = mVar1 / local_c0->channels;
    if (local_e4 == 0) {
      local_b8 = 0;
    }
    else {
      for (; local_d8 != 0; local_d8 = local_d8 - sVar3) {
        local_1110 = local_d8;
        uVar2 = SUB164((ZEXT816(0) << 0x40 | ZEXT816(0x1000)) / ZEXT416(local_e4),0);
        if ((ulong)uVar2 * (ulong)local_e4 < local_d8) {
          local_1110 = (ulong)uVar2 * (ulong)local_e4;
        }
        __dest = local_10f8;
        memcpy(__dest,local_f0,local_1110);
        local_a8 = (ulong)uVar2;
        local_ac = local_e4;
        switch((ma_dr_wav *)(ulong)(local_e4 - 1)) {
        case (ma_dr_wav *)0x0:
          break;
        case (ma_dr_wav *)0x1:
          for (local_98 = 0; local_90 = local_a8, local_88 = __dest, local_98 < local_a8;
              local_98 = local_98 + 1) {
            local_c = *(ushort *)(__dest + local_98 * 2);
            *(ushort *)(__dest + local_98 * 2) = local_c << 8 | local_c >> 8;
            local_a = local_c;
          }
          break;
        case (ma_dr_wav *)0x2:
          for (local_60 = 0; local_58 = local_a8, local_50 = __dest, local_60 < local_a8;
              local_60 = local_60 + 1) {
            local_68 = __dest + local_60 * 3;
            local_29 = *local_68;
            *local_68 = local_68[2];
            local_68[2] = local_29;
            local_28 = local_68;
          }
          break;
        case (ma_dr_wav *)0x3:
          for (local_80 = 0; local_78 = local_a8, local_70 = __dest, local_80 < local_a8;
              local_80 = local_80 + 1) {
            local_8 = *(uint *)(__dest + local_80 * 4);
            *(uint *)(__dest + local_80 * 4) =
                 local_8 >> 0x18 | (local_8 & 0xff0000) >> 8 | (local_8 & 0xff00) << 8 |
                 local_8 << 0x18;
            local_4 = local_8;
          }
          break;
        default:
          break;
        case (ma_dr_wav *)0x7:
          for (local_48 = 0; local_40 = local_a8, local_38 = __dest, local_48 < local_a8;
              local_48 = local_48 + 1) {
            local_20 = *(ulong *)(__dest + local_48 * 8);
            *(ulong *)(__dest + local_48 * 8) =
                 local_20 >> 0x38 | (local_20 & 0xff000000000000) >> 0x28 |
                 (local_20 & 0xff0000000000) >> 0x18 | (local_20 & 0xff00000000) >> 8 |
                 (local_20 & 0xff000000) << 8 | (local_20 & 0xff0000) << 0x18 |
                 (local_20 & 0xff00) << 0x28 | local_20 << 0x38;
            local_18 = local_20;
          }
        }
        local_a0 = __dest;
        sVar3 = ma_dr_wav_write_raw((ma_dr_wav *)(ulong)(local_e4 - 1),(size_t)__dest,
                                    in_stack_ffffffffffffeed8);
        if (sVar3 == 0) break;
        local_e0 = sVar3 + local_e0;
        local_f0 = (void *)(sVar3 + (long)local_f0);
      }
      local_b8 = ((ulong)(local_e0 << 3) / (ulong)local_c0->bitsPerSample) /
                 (ulong)local_c0->channels;
    }
  }
  return local_b8;
}

Assistant:

MA_API ma_uint64 ma_dr_wav_write_pcm_frames_be(ma_dr_wav* pWav, ma_uint64 framesToWrite, const void* pData)
{
    ma_uint64 bytesToWrite;
    ma_uint64 bytesWritten;
    ma_uint32 bytesPerSample;
    const ma_uint8* pRunningData;
    if (pWav == NULL || framesToWrite == 0 || pData == NULL) {
        return 0;
    }
    bytesToWrite = ((framesToWrite * pWav->channels * pWav->bitsPerSample) / 8);
    if (bytesToWrite > MA_SIZE_MAX) {
        return 0;
    }
    bytesWritten = 0;
    pRunningData = (const ma_uint8*)pData;
    bytesPerSample = ma_dr_wav_get_bytes_per_pcm_frame(pWav) / pWav->channels;
    if (bytesPerSample == 0) {
        return 0;
    }
    while (bytesToWrite > 0) {
        ma_uint8 temp[4096];
        ma_uint32 sampleCount;
        size_t bytesJustWritten;
        ma_uint64 bytesToWriteThisIteration;
        bytesToWriteThisIteration = bytesToWrite;
        MA_DR_WAV_ASSERT(bytesToWriteThisIteration <= MA_SIZE_MAX);
        sampleCount = sizeof(temp)/bytesPerSample;
        if (bytesToWriteThisIteration > ((ma_uint64)sampleCount)*bytesPerSample) {
            bytesToWriteThisIteration = ((ma_uint64)sampleCount)*bytesPerSample;
        }
        MA_DR_WAV_COPY_MEMORY(temp, pRunningData, (size_t)bytesToWriteThisIteration);
        ma_dr_wav__bswap_samples(temp, sampleCount, bytesPerSample);
        bytesJustWritten = ma_dr_wav_write_raw(pWav, (size_t)bytesToWriteThisIteration, temp);
        if (bytesJustWritten == 0) {
            break;
        }
        bytesToWrite -= bytesJustWritten;
        bytesWritten += bytesJustWritten;
        pRunningData += bytesJustWritten;
    }
    return (bytesWritten * 8) / pWav->bitsPerSample / pWav->channels;
}